

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerQueue.cpp
# Opt level: O2

void __thiscall Liby::TimerQueue::TimerQueue(TimerQueue *this,Poller *poller)

{
  element_type *__p;
  int iVar1;
  Logger *pLVar2;
  int *piVar3;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  __shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2> local_28;
  
  (this->timerChan_)._M_t.super___uniq_ptr_impl<Liby::Channel,_std::default_delete<Liby::Channel>_>.
  _M_t.super__Tuple_impl<0UL,_Liby::Channel_*,_std::default_delete<Liby::Channel>_>.
  super__Head_base<0UL,_Liby::Channel_*,_false>._M_head_impl = (Channel *)0x0;
  (this->timerfp_).super___shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->timerfp_).super___shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->poller_ = poller;
  BinaryHeap<Liby::WeakTimerHolder>::BinaryHeap(&this->queue_,100);
  if (this->poller_ == (Poller *)0x0) {
    pLVar2 = Logger::getLogger();
    Logger::log(pLVar2,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
  }
  else {
    iVar1 = timerfd_create(0,0x80800);
    this->timerfd_ = iVar1;
    if (-1 < iVar1) {
      std::make_shared<Liby::FileDescriptor,int&>((int *)&local_28);
      std::__shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&(this->timerfp_).
                  super___shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2>,&local_28);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
      std::make_unique<Liby::Channel,Liby::Poller*&,int&>
                ((Poller **)&local_28,(int *)&this->poller_);
      __p = local_28._M_ptr;
      local_28._M_ptr = (element_type *)0x0;
      std::__uniq_ptr_impl<Liby::Channel,_std::default_delete<Liby::Channel>_>::reset
                ((__uniq_ptr_impl<Liby::Channel,_std::default_delete<Liby::Channel>_> *)
                 &this->timerChan_,(pointer)__p);
      std::unique_ptr<Liby::Channel,_std::default_delete<Liby::Channel>_>::~unique_ptr
                ((unique_ptr<Liby::Channel,_std::default_delete<Liby::Channel>_> *)&local_28);
      return;
    }
    pLVar2 = Logger::getLogger();
    piVar3 = __errno_location();
    strerror(*piVar3);
    Logger::log(pLVar2,(double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
  }
  exit(1);
}

Assistant:

TimerQueue::TimerQueue(Poller *poller) : poller_(poller) {
#ifdef __linux__
    fatalif(poller_ == nullptr, "Poller cannot be nullptr");
    timerfd_ = ::timerfd_create(CLOCK_REALTIME, TFD_CLOEXEC | TFD_NONBLOCK);
    fatalif(timerfd_ < 0, "timerfd_create: %s", ::strerror(errno));
    timerfp_ = std::make_shared<FileDescriptor>(timerfd_);
    timerChan_ = std::make_unique<Channel>(poller_, timerfd_);
#endif
}